

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

int32_t icu_63::calcStringSetLength(uint32_t *set,char *s)

{
  byte bVar1;
  long lVar2;
  
  for (lVar2 = 0; bVar1 = *(byte *)((long)set + lVar2), bVar1 != 0; lVar2 = lVar2 + 1) {
    *(uint *)(gNameSet + (ulong)(bVar1 >> 5) * 4) =
         *(uint *)(gNameSet + (ulong)(bVar1 >> 5) * 4) | 1 << (bVar1 & 0x1f);
  }
  return (int32_t)lVar2;
}

Assistant:

static int32_t
calcStringSetLength(uint32_t set[8], const char *s) {
    int32_t length=0;
    char c;

    while((c=*s++)!=0) {
        SET_ADD(set, c);
        ++length;
    }
    return length;
}